

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<unsigned_char,_8UL>::shrink
          (ArrayWithPreallocation<unsigned_char,_8UL> *this,size_t newSize)

{
  bool bVar1;
  size_t newSize_local;
  ArrayWithPreallocation<unsigned_char,_8UL> *this_local;
  
  if (newSize == 0) {
    clear(this);
  }
  else {
    checkAssertion(newSize <= this->numActive,"newSize <= numActive","shrink",0xff);
    while( true ) {
      bVar1 = false;
      if (newSize < this->numActive) {
        bVar1 = this->numActive != 0;
      }
      if (!bVar1) break;
      this->numActive = this->numActive - 1;
    }
  }
  return;
}

Assistant:

void shrink (size_t newSize)
    {
        if (newSize == 0)
            return clear();

        SOUL_ASSERT (newSize <= numActive);

        while (newSize < numActive && numActive > 0)
            items[--numActive].~Item();
    }